

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Own<capnp::ClientHook> *capTable;
  CapTableBuilder *this;
  WirePointer *ref;
  Own<capnp::ClientHook> *cap;
  SegmentBuilder *pSVar1;
  Own<capnp::ClientHook> *in_RCX;
  Own<capnp::ClientHook> *in_RDX;
  SegmentId local_40 [5];
  undefined1 local_29;
  Own<capnp::ClientHook> *copyFrom_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *result;
  
  local_29 = 0;
  copyFrom_local = in_RDX;
  capTable_local = (CapTableBuilder *)src;
  arena_local = (BuilderArena *)dst;
  OrphanBuilder((OrphanBuilder *)dst);
  capTable = copyFrom_local;
  ref = tagAsPtr((OrphanBuilder *)dst);
  cap = kj::mv<kj::Own<capnp::ClientHook>>(in_RCX);
  WireHelpers::setCapabilityPointer((SegmentBuilder *)0x0,(CapTableBuilder *)capTable,ref,cap);
  this = capTable_local;
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(local_40,0);
  pSVar1 = BuilderArena::getSegment((BuilderArena *)this,local_40[0]);
  *(SegmentBuilder **)(dst + 8) = pSVar1;
  *(Own<capnp::ClientHook> **)(dst + 0x10) = copyFrom_local;
  *(EVP_PKEY_CTX **)(dst + 0x18) = dst;
  return (int)dst;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, kj::Own<ClientHook> copyFrom) {
  OrphanBuilder result;
  WireHelpers::setCapabilityPointer(nullptr, capTable, result.tagAsPtr(), kj::mv(copyFrom));
  result.segment = arena->getSegment(SegmentId(0));
  result.capTable = capTable;
  result.location = &result.tag;  // dummy to make location non-null
  return result;
}